

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O2

void __thiscall
TPZFront<double>::SymbolicAddKel(TPZFront<double> *this,TPZVec<long> *destinationindex)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  lVar3 = destinationindex->fNElements;
  if (destinationindex->fNElements < 1) {
    lVar3 = lVar2;
  }
  for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    Local(this,destinationindex->fStore[lVar2]);
    this->fFront = (this->fGlobal).super_TPZVec<long>.fNElements;
  }
  iVar1 = (int)this->fFront;
  if (this->fFront < (long)this->fMaxFront) {
    iVar1 = this->fMaxFront;
  }
  this->fMaxFront = iVar1;
  return;
}

Assistant:

void TPZFront<TVar>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	int64_t i, loop_limit, aux;
	loop_limit=destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		aux=destinationindex[i];
		Local(aux);
		fFront = fGlobal.NElements();
	}
	fMaxFront=(fFront<fMaxFront)?fMaxFront:fFront;
	
}